

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O1

RealType __thiscall OpenMD::RNEMD::RNEMD::getDefaultDividingArea(RNEMD *this)

{
  SelectionEvaluator *pSVar1;
  Snapshot *this_00;
  long lVar2;
  RealType RVar3;
  double dVar4;
  int isd;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> aSites;
  StuntDouble *sd;
  int local_7c;
  Thermo local_78;
  iterator iStack_70;
  StuntDouble **local_68;
  StuntDouble *local_58;
  SelectionSet local_50;
  double local_38;
  
  if (this->hasDividingArea_ == true) {
    return this->dividingArea_;
  }
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this->hasSelectionA_ == true) {
    pSVar1 = &this->evaluatorA_;
    if ((this->evaluatorA_).hasSurfaceArea_ == true) {
      RVar3 = SelectionEvaluator::getSurfaceArea(pSVar1);
      this->areaA_ = RVar3;
      RVar3 = SelectionEvaluator::getVolume(pSVar1);
      goto LAB_0022d828;
    }
    local_78.info_ = (SimInfo *)0x0;
    iStack_70._M_current = (StuntDouble **)0x0;
    local_68 = (StuntDouble **)0x0;
    SelectionEvaluator::evaluate(&local_50,pSVar1);
    lVar2 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleManA_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar2),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_50.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar2));
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_50.bitsets_);
    local_58 = SelectionManager::beginSelected(&this->seleManA_,&local_7c);
    while (local_58 != (StuntDouble *)0x0) {
      if (iStack_70._M_current == local_68) {
        std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
        _M_realloc_insert<OpenMD::StuntDouble*const&>
                  ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&local_78,
                   iStack_70,&local_58);
      }
      else {
        *iStack_70._M_current = local_58;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      local_58 = SelectionManager::nextSelected(&this->seleManA_,&local_7c);
    }
    memcpy(&painCave,
           "RNEMD::getDividingArea : Hull calculation is not possible\n\twithout libqhull. Please rebuild OpenMD with qhull enabled."
           ,0x77);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if (local_78.info_ != (SimInfo *)0x0) {
      operator_delete(local_78.info_,(long)local_68 - (long)local_78.info_);
    }
  }
  else {
    if (this->usePeriodicBoundaryConditions_ == true) {
      if (this->rnemdPrivilegedAxis_ == rnemdY) {
        dVar4 = Snapshot::getXZarea(this_00);
      }
      else if (this->rnemdPrivilegedAxis_ == rnemdX) {
        dVar4 = Snapshot::getYZarea(this_00);
      }
      else {
        dVar4 = Snapshot::getXYarea(this_00);
      }
      this->areaA_ = dVar4 + dVar4;
      RVar3 = (dVar4 + dVar4) * this->slabWidth_;
    }
    else {
      dVar4 = this->sphereARadius_;
      this->areaA_ = dVar4 * dVar4 * 12.566370614359172;
      dVar4 = pow(dVar4,3.0);
      RVar3 = (dVar4 * 12.566370614359172) / 3.0;
    }
LAB_0022d828:
    this->volumeA_ = RVar3;
  }
  if (this->hasSelectionB_ == true) {
    pSVar1 = &this->evaluatorB_;
    if ((this->evaluatorB_).hasSurfaceArea_ != true) {
      local_78.info_ = (SimInfo *)0x0;
      iStack_70._M_current = (StuntDouble **)0x0;
      local_68 = (StuntDouble **)0x0;
      SelectionEvaluator::evaluate(&local_50,pSVar1);
      lVar2 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleManB_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar2),
                   (vector<bool,_std::allocator<bool>_> *)
                   ((long)&((local_50.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar2))
        ;
        lVar2 = lVar2 + 0x28;
      } while (lVar2 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_50.bitsets_);
      local_58 = SelectionManager::beginSelected(&this->seleManB_,&local_7c);
      while (local_58 != (StuntDouble *)0x0) {
        if (iStack_70._M_current == local_68) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>
                    ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&local_78,
                     iStack_70,&local_58);
        }
        else {
          *iStack_70._M_current = local_58;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        local_58 = SelectionManager::nextSelected(&this->seleManB_,&local_7c);
      }
      memcpy(&painCave,
             "RNEMD::getDividingArea : Hull calculation is not possible\n\twithout libqhull. Please rebuild OpenMD with qhull enabled."
             ,0x77);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      if (local_78.info_ != (SimInfo *)0x0) {
        operator_delete(local_78.info_,(long)local_68 - (long)local_78.info_);
      }
      goto LAB_0022da23;
    }
    RVar3 = SelectionEvaluator::getSurfaceArea(pSVar1);
    this->areaB_ = RVar3;
    RVar3 = SelectionEvaluator::getVolume(pSVar1);
  }
  else {
    if (this->usePeriodicBoundaryConditions_ != true) {
      this->areaB_ = this->sphereBRadius_ * this->sphereBRadius_ * 12.566370614359172;
      local_78.info_ = this->info_;
      local_38 = Thermo::getHullVolume(&local_78);
      dVar4 = pow(this->sphereBRadius_,3.0);
      this->volumeB_ = local_38 - (dVar4 * 12.566370614359172) / 3.0;
      goto LAB_0022da23;
    }
    if (this->rnemdPrivilegedAxis_ == rnemdY) {
      dVar4 = Snapshot::getXZarea(this_00);
    }
    else if (this->rnemdPrivilegedAxis_ == rnemdX) {
      dVar4 = Snapshot::getYZarea(this_00);
    }
    else {
      dVar4 = Snapshot::getXYarea(this_00);
    }
    this->areaB_ = dVar4 + dVar4;
    RVar3 = (dVar4 + dVar4) * this->slabWidth_;
  }
  this->volumeB_ = RVar3;
LAB_0022da23:
  dVar4 = this->areaB_;
  if (this->areaA_ <= this->areaB_) {
    dVar4 = this->areaA_;
  }
  this->dividingArea_ = dVar4;
  this->hasDividingArea_ = true;
  return dVar4;
}

Assistant:

RealType RNEMD::getDefaultDividingArea() {
    if (hasDividingArea_) return dividingArea_;

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (hasSelectionA_) {
      if (evaluatorA_.hasSurfaceArea()) {
        areaA_   = evaluatorA_.getSurfaceArea();
        volumeA_ = evaluatorA_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> aSites;
        seleManA_.setSelectionSet(evaluatorA_.evaluate());
        for (sd = seleManA_.beginSelected(isd); sd != NULL;
             sd = seleManA_.nextSelected(isd)) {
          aSites.push_back(sd);
        }
#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshA = new ConvexHull();
        surfaceMeshA->computeHull(aSites);
        areaA_   = surfaceMeshA->getArea();
        volumeA_ = surfaceMeshA->getVolume();
        delete surfaceMeshA;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaA_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaA_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaA_ = 2.0 * snap->getXYarea();
        }

        volumeA_ = areaA_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, the sphere radius sets the surface area of the
        // dividing surface:
        areaA_   = 4.0 * Constants::PI * std::pow(sphereARadius_, 2);
        volumeA_ = 4.0 * Constants::PI * std::pow(sphereARadius_, 3) / 3.0;
      }
    }

    if (hasSelectionB_) {
      if (evaluatorB_.hasSurfaceArea()) {
        areaB_   = evaluatorB_.getSurfaceArea();
        volumeB_ = evaluatorB_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> bSites;
        seleManB_.setSelectionSet(evaluatorB_.evaluate());
        for (sd = seleManB_.beginSelected(isd); sd != NULL;
             sd = seleManB_.nextSelected(isd)) {
          bSites.push_back(sd);
        }

#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshB = new ConvexHull();
        surfaceMeshB->computeHull(bSites);
        areaB_   = surfaceMeshB->getArea();
        volumeB_ = surfaceMeshB->getVolume();
        delete surfaceMeshB;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaB_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaB_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaB_ = 2.0 * snap->getXYarea();
        }

        volumeB_ = areaB_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, but if a sphereBradius has been set, just use that:
        areaB_ = 4.0 * Constants::PI * pow(sphereBRadius_, 2);
        Thermo thermo(info_);
        RealType hVol = thermo.getHullVolume();
        volumeB_ = hVol - 4.0 * Constants::PI * pow(sphereBRadius_, 3) / 3.0;
      }
    }

    dividingArea_    = min(areaA_, areaB_);
    hasDividingArea_ = true;
    return dividingArea_;
  }